

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

int __thiscall testing::TestCase::reportable_test_count(TestCase *this)

{
  int iVar1;
  pointer ppTVar2;
  
  iVar1 = 0;
  for (ppTVar2 = (this->test_info_list_).
                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppTVar2 !=
      (this->test_info_list_).
      super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppTVar2 = ppTVar2 + 1) {
    iVar1 = iVar1 + (uint)(*ppTVar2)->matches_filter_;
  }
  return iVar1;
}

Assistant:

int TestCase::reportable_test_count() const {
  return CountIf(test_info_list_, TestReportable);
}